

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O1

void sc_reduce(limb_t *dst,limb_t *e)

{
  ulong uVar1;
  long lVar2;
  lsc_t tmp;
  ulong local_58 [5];
  long local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar1 = ((long)uVar1 >> 0x34) + e[lVar2];
    local_58[lVar2] = uVar1 & 0xfffffffffffff;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  local_30 = (long)uVar1 >> 0x34;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  uStack_10 = 0;
  sc_barrett(dst,(limb_t *)local_58);
  return;
}

Assistant:

void
sc_reduce(sc_t dst, const sc_t e)
{
	lsc_t tmp;
	limb_t carry;
	int i;

	/* carry e */
	for (carry = 0, i = 0; i < K; i++) {
		carry = (carry >> LB) + e[i];
		tmp[i] = carry & MSK;
	}
	tmp[K] = carry >> LB;
	for (i = K+1; i < 2*K; i++)
		tmp[i] = 0;
	
	/* reduce modulo m */
	sc_barrett(dst, tmp);
}